

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O2

uint __thiscall
PageStack<Memory::MarkContext::MarkCandidate>::Split
          (PageStack<Memory::MarkContext::MarkCandidate> *this,uint targetCount,
          PageStack<Memory::MarkContext::MarkCandidate> **targetStacks)

{
  PageStack<Memory::MarkContext::MarkCandidate> *pPVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  Chunk *pCVar6;
  Chunk *pCVar7;
  Chunk *pCVar8;
  ulong uVar9;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar10 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar11 [16];
  Chunk *pCStack_68;
  Chunk *targetCurrents [3];
  undefined4 *local_40;
  uint local_38;
  
  if (2 < targetCount - 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0xfa,"(targetCount > 0 && targetCount <= MaxSplitTargets)",
                       "targetCount > 0 && targetCount <= MaxSplitTargets");
    if (!bVar3) goto LAB_006666d5;
    *puVar4 = 0;
  }
  if (targetStacks == (PageStack<Memory::MarkContext::MarkCandidate> **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0xfb,"(targetStacks)","targetStacks");
    if (!bVar3) goto LAB_006666d5;
    *puVar4 = 0;
  }
  pCVar7 = this->currentChunk;
  if (pCVar7 == (Chunk *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_40 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x106,"(chunk != nullptr)","chunk != nullptr");
    if (!bVar3) {
LAB_006666d5:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *local_40 = 0;
    auVar10 = extraout_XMM0;
  }
  else {
    local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    auVar10._8_8_ = extraout_XMM0_Qb;
    auVar10._0_8_ = extraout_XMM0_Qa;
  }
  uVar5 = (ulong)targetCount;
  uVar9 = 0;
  auVar11 = pmovsxwq(in_XMM2,0xffffff02);
  pCVar6 = pCVar7;
  do {
    pCVar6 = pCVar6->nextChunk;
    local_38 = targetCount;
    if (uVar5 == uVar9) {
LAB_00666643:
      auVar10 = pmovzxbq(auVar10,0x1fe);
      while (pCVar8 = pCVar6, pCVar8 != (Chunk *)0x0) {
        pCVar7->nextChunk = pCVar8;
        uVar9 = 0;
        pCVar6 = pCVar8;
        while ((pCVar6 = pCVar6->nextChunk, pCVar7 = pCVar8, uVar9 < uVar5 &&
               (pCVar6 != (Chunk *)0x0))) {
          targetCurrents[uVar9 - 1]->nextChunk = pCVar6;
          targetCurrents[uVar9 - 1] = pCVar6;
          pPVar1 = targetStacks[uVar9];
          this->count = this->count + auVar11._0_8_;
          this->pageCount = this->pageCount + auVar11._8_8_;
          pPVar1->count = pPVar1->count + auVar10._0_8_;
          pPVar1->pageCount = pPVar1->pageCount + auVar10._8_8_;
          uVar9 = uVar9 + 1;
        }
      }
      pCVar7->nextChunk = (Chunk *)0x0;
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        targetCurrents[uVar9 - 1]->nextChunk = (Chunk *)0x0;
      }
      return local_38;
    }
    if (pCVar6 == (Chunk *)0x0) {
      pCVar6 = (Chunk *)0x0;
      local_38 = (uint)uVar9;
      uVar5 = uVar9;
      goto LAB_00666643;
    }
    bVar3 = IsEmpty(targetStacks[uVar9]);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_40 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                         ,0x11a,"(targetStacks[targetIndex]->IsEmpty())",
                         "targetStacks[targetIndex]->IsEmpty()");
      if (!bVar3) goto LAB_006666d5;
      *local_40 = 0;
    }
    Release(targetStacks[uVar9]);
    targetStacks[uVar9]->currentChunk = pCVar6;
    targetStacks[uVar9]->chunkStart = (MarkCandidate *)(pCVar6 + 1);
    targetStacks[uVar9]->chunkEnd = (MarkCandidate *)(pCVar6 + 0x80);
    targetStacks[uVar9]->nextEntry = targetStacks[uVar9]->chunkEnd;
    pPVar1 = targetStacks[uVar9];
    auVar11 = pmovsxwq(auVar11,0xffffff02);
    auVar10._0_8_ = this->count + auVar11._0_8_;
    auVar10._8_8_ = this->pageCount + auVar11._8_8_;
    this->count = auVar10._0_8_;
    this->pageCount = auVar10._8_8_;
    pPVar1->pageCount = 1;
    pPVar1->count = 0xfe;
    targetCurrents[uVar9 - 1] = pCVar6;
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

uint PageStack<T>::Split(uint targetCount, __in_ecount(targetCount) PageStack<T> ** targetStacks)
{
    // Split the current stack up to [targetCount + 1] ways.
    // [targetStacks] contains the target stacks and must have [targetCount] elements.

    Assert(targetCount > 0 && targetCount <= MaxSplitTargets);
    Assert(targetStacks);
    __analysis_assume(targetCount <= MaxSplitTargets);

    Chunk * mainCurrent;
    Chunk * targetCurrents[MaxSplitTargets];

    // Do the initial split of first pages for each target stack.
    // During this, if we run out of pages, we will return a value < maxSplit to
    // indicate that the split was less than the maximum possible.

    Chunk * chunk = this->currentChunk;
    Assert(chunk != nullptr);

    // The first chunk is assigned to the main stack, and since it's already there,
    // we just advance to the next chunk and start assigning to each target stack.
    mainCurrent = chunk;
    chunk = chunk->nextChunk;

    uint targetIndex = 0;
    while (targetIndex < targetCount)
    {
        if (chunk == nullptr)
        {
            // No more pages.  Adjust targetCount down to what we were actually able to do.
            // We'll return this number below so the caller knows.
            targetCount = targetIndex;
            break;
        }

        // Target stack should be empty.
        // If it has a free page currently, release it.
        Assert(targetStacks[targetIndex]->IsEmpty());
        targetStacks[targetIndex]->Release();

        targetStacks[targetIndex]->currentChunk = chunk;
        targetStacks[targetIndex]->chunkStart = chunk->entries;
        targetStacks[targetIndex]->chunkEnd = &chunk->entries[EntriesPerChunk];
        targetStacks[targetIndex]->nextEntry = targetStacks[targetIndex]->chunkEnd;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        this->pageCount--;
        targetStacks[targetIndex]->pageCount = 1;
#endif
#if DBG
        this->count -= EntriesPerChunk;
        targetStacks[targetIndex]->count = EntriesPerChunk;
#endif

        targetCurrents[targetIndex] = chunk;

        chunk = chunk->nextChunk;
        targetIndex++;
    }

    // Loop through the remaining chunks (if any),
    // assigning each chunk to the main chunk and the target chunks in turn,
    // and linking each chunk to the end of the respective list.
    while (true)
    {
        if (chunk == nullptr)
        {
            break;
        }

        mainCurrent->nextChunk = chunk;
        mainCurrent = chunk;

        chunk = chunk->nextChunk;

        targetIndex = 0;
        while (targetIndex < targetCount)
        {
            if (chunk == nullptr)
            {
                break;
            }

            targetCurrents[targetIndex]->nextChunk = chunk;
            targetCurrents[targetIndex] = chunk;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            this->pageCount--;
            targetStacks[targetIndex]->pageCount++;
#endif
#if DBG
            this->count -= EntriesPerChunk;
            targetStacks[targetIndex]->count += EntriesPerChunk;
#endif

            chunk = chunk->nextChunk;
            targetIndex++;
        }
    }

    // Terminate all the split chunk lists with null
    mainCurrent->nextChunk = nullptr;
    targetIndex = 0;
    while (targetIndex < targetCount)
    {
        targetCurrents[targetIndex]->nextChunk = nullptr;
        targetIndex++;
    }

    // Return the actual split count we were able to do, which may have been lowered above.
    return targetCount;
}